

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O3

void __thiscall PointToPoint::kernel(PointToPoint *this,int param_1,int it)

{
  MPI_Request *ppoVar1;
  uint uVar2;
  int iVar3;
  
  ppoVar1 = (this->super_HalosExchange).reqs;
  iVar3 = (this->super_HalosExchange).n_partners;
  if (0 < iVar3) {
    uVar2 = 0;
    do {
      (*(this->super_HalosExchange).super_Computation._vptr_Computation[7])
                (this,(ulong)uVar2,ppoVar1,ppoVar1 + 1,0);
      iVar3 = (this->super_HalosExchange).n_partners;
      uVar2 = uVar2 + 1;
      ppoVar1 = ppoVar1 + 2;
    } while ((int)uVar2 < iVar3);
    ppoVar1 = (this->super_HalosExchange).reqs;
  }
  MPI_Waitall(iVar3 * 2,ppoVar1,0);
  return;
}

Assistant:

inline void kernel(int, int it) override
    {
#ifdef DEBUG_MODE
        fill_sbuf(it);
#endif
        // pointer to the first request.
        auto* rq = reqs;
        for (int i = 0; i < n_partners; i++)
        {
            // As long as there is a waitall between iterations, we do not need
            // to use incremental tags across iterations.
            sendrecv(i, rq, rq + 1, 0);
            rq += 2;
        }

        MPI_Waitall(2 * n_partners, reqs, MPI_STATUSES_IGNORE);
#ifdef DEBUG_MODE
        for (int i = 0; i < n_partners; i++)
            check_rbuf(i, it);
#endif
    }